

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O0

void surv0_pipe_close(void *arg)

{
  long lVar1;
  int iVar2;
  surv0_sock *s;
  surv0_pipe *p;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x68));
  nni_aio_close((nni_aio *)((long)arg + 0x230));
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x20));
  *(undefined1 *)((long)arg + 0x3f9) = 1;
  nni_lmq_flush((nni_lmq *)((long)arg + 0x10));
  iVar2 = nni_list_active((nni_list *)(lVar1 + 8),arg);
  if (iVar2 != 0) {
    nni_list_remove((nni_list *)(lVar1 + 8),arg);
  }
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x20));
  return;
}

Assistant:

static void
surv0_pipe_close(void *arg)
{
	surv0_pipe *p = arg;
	surv0_sock *s = p->sock;

	nni_aio_close(&p->aio_send);
	nni_aio_close(&p->aio_recv);

	nni_mtx_lock(&s->mtx);
	p->closed = true;
	nni_lmq_flush(&p->send_queue);
	if (nni_list_active(&s->pipes, p)) {
		nni_list_remove(&s->pipes, p);
	}
	nni_mtx_unlock(&s->mtx);
}